

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStaticEnumerator.cpp
# Opt level: O3

JavascriptString * __thiscall
Js::JavascriptStaticEnumerator::MoveAndGetNextFromEnumerator
          (JavascriptStaticEnumerator *this,PropertyId *propertyId,PropertyAttributes *attributes)

{
  Type *addr;
  Type TVar1;
  int iVar2;
  undefined4 extraout_var;
  JavascriptEnumerator *pJVar3;
  Type local_38;
  
  pJVar3 = (this->currentEnumerator).ptr;
  if (pJVar3 != (JavascriptEnumerator *)0x0) {
    addr = &this->currentEnumerator;
    do {
      iVar2 = (*(pJVar3->super_RecyclableObject).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[99])
                        (pJVar3,propertyId,attributes);
      if ((JavascriptString *)CONCAT44(extraout_var,iVar2) != (JavascriptString *)0x0) {
        return (JavascriptString *)CONCAT44(extraout_var,iVar2);
      }
      if ((this->currentEnumerator).ptr == (this->prefixEnumerator).ptr) {
        pJVar3 = (this->arrayEnumerator).ptr;
        Memory::Recycler::WBSetBit((char *)&local_38);
        local_38.ptr = pJVar3;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
      }
      else {
        local_38.ptr = (JavascriptEnumerator *)0x0;
      }
      TVar1.ptr = local_38.ptr;
      Memory::Recycler::WBSetBit((char *)addr);
      addr->ptr = TVar1.ptr;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      pJVar3 = addr->ptr;
    } while (pJVar3 != (JavascriptEnumerator *)0x0);
  }
  return (JavascriptString *)0x0;
}

Assistant:

JavascriptString * JavascriptStaticEnumerator::MoveAndGetNextFromEnumerator(PropertyId& propertyId, PropertyAttributes* attributes)
    {
        while (this->currentEnumerator)
        {
            JavascriptString * currentIndex = this->currentEnumerator->MoveAndGetNext(propertyId, attributes);
            if (currentIndex != nullptr)
            {
                return currentIndex;
            }
            this->currentEnumerator = (this->currentEnumerator == this->prefixEnumerator) ? this->arrayEnumerator : nullptr;
        }

        return nullptr;
    }